

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamToolsIndex::ReadBlocks
          (BamToolsIndex *this,BtiReferenceSummary *refSummary,BtiBlockVector *blocks)

{
  int *in_RSI;
  int i;
  BtiBlock block;
  BtiBlock *in_stack_00000038;
  int local_50;
  int32_t local_4c;
  value_type *__x;
  undefined4 in_stack_ffffffffffffffc0;
  int32_t iVar1;
  size_type in_stack_ffffffffffffffd8;
  vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
  *in_stack_ffffffffffffffe0;
  
  std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>::clear
            ((vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_> *)
             0x2dec26);
  std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>::reserve
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  Seek((BamToolsIndex *)block._16_8_,(int64_t *)block.StartOffset,block._4_4_);
  iVar1 = 0;
  __x = (value_type *)0x0;
  local_4c = 0;
  BtiBlock::BtiBlock((BtiBlock *)&stack0xffffffffffffffc8,(int32_t *)&stack0xffffffffffffffc4,
                     (int64_t *)&stack0xffffffffffffffb8,&local_4c);
  for (local_50 = 0; local_50 < *in_RSI; local_50 = local_50 + 1) {
    ReadBlock((BamToolsIndex *)blocks,in_stack_00000038);
    std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>::
    push_back((vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_> *
              )CONCAT44(iVar1,in_stack_ffffffffffffffc0),__x);
  }
  return;
}

Assistant:

void BamToolsIndex::ReadBlocks(const BtiReferenceSummary& refSummary, BtiBlockVector& blocks)
{

    // prep blocks container
    blocks.clear();
    blocks.reserve(refSummary.NumBlocks);

    // skip to first block entry
    Seek(refSummary.FirstBlockFilePosition, SEEK_SET);

    // read & store block entries
    BtiBlock block;
    for (int i = 0; i < refSummary.NumBlocks; ++i) {
        ReadBlock(block);
        blocks.push_back(block);
    }
}